

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O1

Token __thiscall flow::lang::Lexer::parseIdent(Lexer *this)

{
  string *psVar1;
  anon_struct_16_2_6b51f6ec *paVar2;
  ulong uVar3;
  char *__s2;
  int iVar4;
  int iVar5;
  Token TVar6;
  anon_struct_16_2_6b51f6ec *paVar7;
  bool bVar8;
  
  psVar1 = &this->stringValue_;
  (this->stringValue_)._M_string_length = 0;
  *(this->stringValue_)._M_dataplus._M_p = '\0';
  std::__cxx11::string::push_back((char)psVar1);
  iVar4 = isxdigit(this->currentChar_);
  bVar8 = iVar4 != 0;
  while( true ) {
    nextChar(this,true);
    iVar4 = this->currentChar_;
    iVar5 = isalnum(iVar4);
    if (((iVar5 == 0) && (iVar4 != 0x5f)) && (iVar4 != 0x2e)) break;
    std::__cxx11::string::push_back((char)psVar1);
    iVar4 = isxdigit(this->currentChar_);
    if (iVar4 == 0) {
      bVar8 = false;
    }
  }
  if ((iVar4 == 0x3a) && (!bVar8)) {
    nextChar(this,true);
    return NamedParam;
  }
  uVar3 = (this->stringValue_)._M_string_length;
  if (((uVar3 < 5) && (iVar4 == 0x3a)) && (bVar8)) {
    bVar8 = true;
  }
  else {
    if (((3 < uVar3) || (!bVar8)) || (iVar4 = isxdigit(iVar4), iVar4 == 0)) {
      __s2 = (psVar1->_M_dataplus)._M_p;
      TVar6 = strcmp("in",__s2);
      paVar7 = parseIdent::keywords;
      if (TVar6 == Unknown) {
        bVar8 = false;
      }
      else {
        do {
          paVar2 = paVar7 + 1;
          bVar8 = paVar2->symbol == (char *)0x0;
          if (bVar8) goto LAB_0013b4f3;
          paVar7 = paVar7 + 1;
          TVar6 = strcmp(paVar2->symbol,__s2);
        } while (TVar6 != Unknown);
      }
      TVar6 = paVar7->token;
      this->token_ = TVar6;
LAB_0013b4f3:
      if (bVar8) {
        iVar4 = std::__cxx11::string::compare((char *)psVar1);
        if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)psVar1), iVar4 == 0)) {
          this->numberValue_ = 1;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)psVar1);
          if ((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)psVar1), iVar4 != 0)) {
            this->token_ = Ident;
            return Ident;
          }
          this->numberValue_ = 0;
        }
        this->token_ = Boolean;
        TVar6 = Boolean;
      }
      return TVar6;
    }
    bVar8 = false;
  }
  TVar6 = continueParseIPv6(this,bVar8);
  return TVar6;
}

Assistant:

Token Lexer::parseIdent() {
  stringValue_.clear();
  stringValue_ += static_cast<char>(currentChar());
  bool isHex = isHexChar();

  nextChar();

  while (std::isalnum(currentChar()) || currentChar() == '_' ||
         currentChar() == '.') {
    stringValue_ += static_cast<char>(currentChar());
    if (!isHexChar()) isHex = false;

    nextChar();
  }

  if (currentChar() == ':' && !isHex) {
    nextChar();  // skip ':'
    return Token::NamedParam;
  }

  // ipv6HexDigit4 *(':' ipv6HexDigit4) ['::' [ipv6HexSeq]]
  if (stringValue_.size() <= 4 && isHex && currentChar() == ':')
    return continueParseIPv6(true);

  if (stringValue_.size() < 4 && isHex && isHexChar())
    return continueParseIPv6(false);

  static struct {
    const char* symbol;
    Token token;
  } keywords[] = {{"in", Token::In},
                  {"var", Token::Var},
                  {"match", Token::Match},
                  {"on", Token::On},
                  {"for", Token::For},
                  {"do", Token::Do},
                  {"if", Token::If},
                  {"then", Token::Then},
                  {"else", Token::Else},
                  {"while", Token::While},
                  {"unless", Token::Unless},
                  {"import", Token::Import},
                  {"from", Token::From},
                  {"handler", Token::Handler},
                  {"and", Token::And},
                  {"or", Token::Or},
                  {"xor", Token::Xor},
                  {"not", Token::Not},
                  {"shl", Token::Shl},
                  {"shr", Token::Shr},
                  {"bool", Token::BoolType},
                  {"int", Token::NumberType},
                  {"string", Token::StringType},
                  {nullptr, Token::Unknown}};

  for (auto i = keywords; i->symbol; ++i)
    if (strcmp(i->symbol, stringValue_.c_str()) == 0) return token_ = i->token;

  if (stringValue_ == "true" || stringValue_ == "yes") {
    numberValue_ = 1;
    return token_ = Token::Boolean;
  }

  if (stringValue_ == "false" || stringValue_ == "no") {
    numberValue_ = 0;
    return token_ = Token::Boolean;
  }

  return token_ = Token::Ident;
}